

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Sbl_ManUpdateMapping(Sbl_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (p->vSolInit->nSize <= p->vSolBest->nSize) {
    __assert_fail("Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x218,"void Sbl_ManUpdateMapping(Sbl_Man_t *)");
  }
  pVVar12 = p->vAnds;
  if (0 < pVVar12->nSize) {
    piVar3 = pVVar12->pArray;
    pGVar4 = p->pGia;
    pVVar5 = pGVar4->vMapping2;
    lVar13 = 0;
    do {
      lVar14 = (long)piVar3[lVar13];
      if ((lVar14 < 0) || (pVVar5->nSize <= piVar3[lVar13])) goto LAB_0074d725;
      pVVar6 = pVVar5->pArray;
      if (0 < pVVar6[lVar14].nSize) {
        piVar7 = pGVar4->pLutRefs;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x235,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
        }
        piVar8 = pVVar6[lVar14].pArray;
        lVar15 = 0;
        do {
          piVar1 = piVar7 + piVar8[lVar15];
          *piVar1 = *piVar1 + -1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar6[lVar14].nSize);
      }
      pVVar6[lVar14].nSize = 0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar12->nSize);
  }
  pVVar12 = p->vSolBest;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      iVar2 = pVVar12->pArray[lVar13];
      lVar14 = (long)iVar2;
      if ((((lVar14 < 0) || (p->vCutsI1->nSize <= iVar2)) || (p->vCutsI2->nSize <= iVar2)) ||
         ((p->vCutsN1->nSize <= iVar2 || (p->vCutsN2->nSize <= iVar2)))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (p->vCutsObj->nSize <= iVar2) {
LAB_0074d6e7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCutsObj->pArray[lVar14];
      if (((long)iVar2 < 0) || (p->vAnds->nSize <= iVar2)) goto LAB_0074d6e7;
      iVar2 = p->vAnds->pArray[iVar2];
      lVar15 = (long)iVar2;
      if ((lVar15 < 0) || (pVVar5 = p->pGia->vMapping2, pVVar5->nSize <= iVar2)) {
LAB_0074d725:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar17 = p->vCutsI1->pArray[lVar14];
      uVar9 = p->vCutsI2->pArray[lVar14];
      uVar10 = p->vCutsN1->pArray[lVar14];
      uVar11 = p->vCutsN2->pArray[lVar14];
      pVVar6 = pVVar5->pArray;
      pVVar12 = pVVar6 + lVar15;
      pVVar6[lVar15].nSize = 0;
      uVar16 = 0;
      do {
        if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
          if ((long)p->vLeaves->nSize <= (long)uVar16) goto LAB_0074d6e7;
          Vec_IntPush(pVVar12,p->vLeaves->pArray[uVar16]);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x40);
      uVar17 = 0;
      do {
        if ((uVar9 >> (uVar17 & 0x3f) & 1) != 0) {
          if ((long)p->vLeaves->nSize <= (long)(uVar17 + 0x40)) goto LAB_0074d6e7;
          Vec_IntPush(pVVar12,p->vLeaves->pArray[uVar17 + 0x40]);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 0x40);
      uVar17 = 0;
      do {
        if ((uVar10 >> (uVar17 & 0x3f) & 1) != 0) {
          if ((long)p->vAnds->nSize <= (long)uVar17) goto LAB_0074d6e7;
          Vec_IntPush(pVVar12,p->vAnds->pArray[uVar17]);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 0x40);
      uVar17 = 0;
      do {
        if ((uVar11 >> (uVar17 & 0x3f) & 1) != 0) {
          if ((long)p->vAnds->nSize <= (long)(uVar17 + 0x40)) goto LAB_0074d6e7;
          Vec_IntPush(pVVar12,p->vAnds->pArray[uVar17 + 0x40]);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 0x40);
      if (0 < pVVar12->nSize) {
        piVar3 = p->pGia->pLutRefs;
        if (piVar3 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x234,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
        }
        piVar7 = pVVar12->pArray;
        lVar14 = 0;
        do {
          piVar8 = piVar3 + piVar7[lVar14];
          *piVar8 = *piVar8 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < pVVar12->nSize);
      }
      lVar13 = lVar13 + 1;
      pVVar12 = p->vSolBest;
    } while (lVar13 < pVVar12->nSize);
  }
  return;
}

Assistant:

void Sbl_ManUpdateMapping( Sbl_Man_t * p )
{
//    Gia_Obj_t * pObj;
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj, iTemp; 
    assert( Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        vObj = Vec_WecEntry(p->pGia->vMapping2, iObj);
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
        Vec_IntClear( vObj );
    }
    Vec_IntForEachEntry( p->vSolBest, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj = Vec_IntEntry( p->vCutsObj, c );
        iObj = Vec_IntEntry( p->vAnds, iObj );
        vObj = Vec_WecEntry( p->pGia->vMapping2, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
    }
/*
    // verify
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefDecId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );

    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        if ( p->pGia->pLutRefs[i] )
            printf( "Object %d has %d refs\n", i, p->pGia->pLutRefs[i] );

    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefIncId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
*/
}